

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O0

void perf_compute_integral_img
               (_func_void_float_ptr_integral_image_ptr *function,float *gray_image,
               benchmark_data *data,bool is_padded)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  iterator __first;
  reference pvVar3;
  byte in_CL;
  undefined8 uVar4;
  long in_RDX;
  undefined8 in_RSI;
  code *in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 extraout_var [56];
  undefined1 auVar8 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double flops_per_cycle;
  size_t i_1;
  size_t j;
  double total_cycles;
  vector<double,_std::allocator<double>_> cycleslist;
  size_t i;
  integral_image *iimage;
  uint64_t end;
  uint64_t start;
  double multiplier;
  long num_runs;
  double cycles;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  vector<double,_std::allocator<double>_> *this;
  value_type_conflict *in_stack_ffffffffffffff48;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  ulong local_88;
  ulong local_80;
  double local_78;
  vector<double,_std::allocator<double>_> local_70;
  ulong local_58;
  integral_image *local_50;
  unsigned_long_long local_48;
  unsigned_long_long local_40;
  double local_38;
  ulong local_30;
  double local_28;
  byte local_19;
  long local_18;
  undefined8 local_10;
  code *local_8;
  
  local_19 = in_CL & 1;
  local_28 = 0.0;
  local_30 = 100;
  local_38 = 1.0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (local_19 == 0) {
    local_50 = create_integral_img((int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                                   (int)in_stack_ffffffffffffff40);
  }
  else {
    local_50 = create_padded_integral_img
                         ((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                          (int)in_stack_ffffffffffffff50);
  }
  do {
    auVar7 = ZEXT864((ulong)((double)(long)local_30 * local_38));
    local_30 = (ulong)((double)(long)local_30 * local_38);
    local_40 = start_tsc();
    for (local_58 = 0; auVar5 = auVar7._0_16_, local_58 < local_30; local_58 = local_58 + 1) {
      auVar7._0_8_ = (*local_8)(local_10,local_50);
      auVar7._8_56_ = extraout_var;
    }
    local_48 = stop_tsc(local_40);
    auVar5 = vcvtusi2sd_avx512f(auVar5,local_48);
    local_28 = auVar5._0_8_;
    local_38 = 100000000.0 / local_28;
  } while (2.0 < local_38);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x119c0f);
  auVar8 = ZEXT1664((undefined1  [16])0x0);
  local_78 = 0.0;
  for (local_80 = 0; local_80 < 10; local_80 = local_80 + 1) {
    local_40 = start_tsc();
    for (local_88 = 0; auVar5 = auVar8._0_16_, local_88 < local_30; local_88 = local_88 + 1) {
      auVar8._0_8_ = (*local_8)(local_10,local_50);
      auVar8._8_56_ = extraout_var_00;
    }
    local_48 = stop_tsc(local_40);
    auVar5 = vcvtusi2sd_avx512f(auVar5,local_48);
    local_28 = auVar5._0_8_ / (double)(long)local_30;
    local_78 = local_78 + local_28;
    auVar8 = ZEXT864((ulong)local_78);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  free(local_50->padded_data);
  free(local_50);
  auVar6._0_8_ = ((double)*(long *)(local_18 + 0x210) * 100.0) / (local_78 / 10.0);
  auVar6._8_8_ = 0;
  auVar11._8_8_ = 0x8000000000000000;
  auVar11._0_8_ = 0x8000000000000000;
  auVar9._8_8_ = 0x3fdfffffffffffff;
  auVar9._0_8_ = 0x3fdfffffffffffff;
  auVar5 = vpternlogq_avx512vl(auVar9,auVar6,auVar11,0xf8);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = auVar6._0_8_ + auVar5._0_8_;
  auVar6 = vroundsd_avx(auVar6,auVar10,0xb);
  __last._M_current = (double *)&local_70;
  local_28 = local_78 / 10.0;
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff38);
  __first = std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff38);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __first._M_current,__last);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_28;
  uVar4 = vcvttsd2usi_avx512f(auVar5);
  *(undefined8 *)(local_18 + 0x218) = uVar4;
  this = &local_70;
  pvVar3 = std::vector<double,_std::allocator<double>_>::front(this);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *pvVar3;
  uVar4 = vcvttsd2usi_avx512f(auVar1);
  *(undefined8 *)(local_18 + 0x220) = uVar4;
  pvVar3 = std::vector<double,_std::allocator<double>_>::back(this);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *pvVar3;
  uVar4 = vcvttsd2usi_avx512f(auVar2);
  *(undefined8 *)(local_18 + 0x228) = uVar4;
  *(double *)(local_18 + 0x230) = auVar6._0_8_ / 100.0;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)__first._M_current);
  return;
}

Assistant:

void perf_compute_integral_img(void (*function)(float *, struct integral_image *), float *gray_image,
                               struct benchmark_data &data, bool is_padded) {
    double cycles = 0.;
    long num_runs = 100;
    double multiplier = 1;
    uint64_t start, end;

    // Checking if integral image should be padded and initializing it
    struct integral_image *iimage;
    if (!is_padded) {
        iimage = create_integral_img(data.width, data.height);
    } else {
        iimage = create_padded_integral_img(data.width, data.height);
    }

#ifdef WARM_UP
    // Warm-up phase: we determine a number of executions that allows
    // the code to be executed for at least CYCLES_REQUIRED cycles.
    // This helps excluding timing overhead when measuring small runtimes.
    do {
        num_runs = num_runs * multiplier;
        start = start_tsc();
        for (size_t i = 0; i < num_runs; i++) {
            (*function)(gray_image, iimage);
        }
        end = stop_tsc(start);

        cycles = (double)end;
        multiplier = (CYCLES_REQUIRED) / (cycles);

    } while (multiplier > 2);
#endif

    std::vector<double> cycleslist;

    // Actual performance measurements repeated REP times.
    // We simply store all results and compute medians during post-processing.
    double total_cycles = 0;
    for (size_t j = 0; j < REP; j++) {
        start = start_tsc();
        for (size_t i = 0; i < num_runs; ++i) {
            (*function)(gray_image, iimage);
        }
        end = stop_tsc(start);

        cycles = ((double)end) / num_runs;
        total_cycles += cycles;

        cycleslist.push_back(cycles);
    }
    total_cycles /= REP;

    free(iimage->padded_data);
    free(iimage);

    cycles = total_cycles;  // cyclesList.front();
    double flops_per_cycle = round((100.0 * data.num_flops) / cycles) / 100.0;
    std::sort(cycleslist.begin(), cycleslist.end());
    data.avg_cycles = (uint64_t)cycles;
    data.min_cycles = (uint64_t)cycleslist.front();
    data.max_cycles = (uint64_t)cycleslist.back();
    data.flops_per_cycle = flops_per_cycle;
}